

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

void __thiscall
PartiallySignedTransaction::Unserialize<DataStream>(PartiallySignedTransaction *this,DataStream *s)

{
  map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  *this_00;
  CScriptWitness *pCVar1;
  long lVar2;
  pointer pCVar3;
  uint uVar4;
  undefined8 uVar5;
  pointer puVar6;
  pointer puVar7;
  bool bVar8;
  bool bVar9;
  uint64_t uVar10;
  size_type sVar11;
  size_type sVar12;
  size_type sVar13;
  _Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
  *p_Var14;
  size_type sVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  char *pcVar19;
  pointer pCVar20;
  uint uVar21;
  CExtPubKey *pCVar22;
  pointer pbVar23;
  CExtPubKey *pCVar24;
  pointer pbVar25;
  size_type sVar26;
  long in_FS_OFFSET;
  byte bVar27;
  pair<std::_Rb_tree_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  pVar28;
  SpanReader skey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  KeyOriginInfo keypath;
  uint8_t magic [5];
  PSBTProprietary this_prop;
  _Rb_tree_node_base local_388;
  _Base_ptr local_368;
  _Rb_tree_node_base local_358;
  _Base_ptr local_338;
  _Rb_tree_node_base local_328;
  _Base_ptr local_308;
  uint32_t v;
  undefined4 uStack_10c;
  CExtPubKey *local_108;
  set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> global_xpubs;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  key_lookup;
  
  bVar27 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  Unserialize<DataStream,_unsigned_char,_5>(s,&magic);
  bVar8 = std::__equal<true>::equal<unsigned_char>
                    ((uchar *)magic,(uchar *)&this_prop,PSBT_MAGIC_BYTES);
  if (bVar8) {
    key_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &key_lookup._M_t._M_impl.super__Rb_tree_header._M_header;
    key_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    key_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    key_lookup._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    global_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &global_xpubs._M_t._M_impl.super__Rb_tree_header._M_header;
    global_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    global_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    global_xpubs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00 = &this->m_xpubs;
    bVar8 = false;
    global_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         global_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    key_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         key_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if ((long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start == s->m_read_pos) break;
      key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,&key);
      puVar7 = key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar6 = key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start ==
          key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar8 = true;
      }
      else {
        skey.m_data.m_size =
             (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        skey.m_data.m_data =
             key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        uVar10 = ReadCompactSize<SpanReader>(&skey,true);
        if (uVar10 == 0) {
          pVar28 = std::
                   _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                   ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                             ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                               *)&key_lookup,&key);
          if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            pcVar19 = (char *)__cxa_allocate_exception(0x20);
            this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
            this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar19,(error_code *)"Duplicate Key, unsigned tx already provided");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_0064ea78;
          }
          if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != 1) {
            pcVar19 = (char *)__cxa_allocate_exception(0x20);
            this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
            this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar19,(error_code *)"Global unsigned tx key is more than one byte type");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_0064ea78;
          }
          CMutableTransaction::CMutableTransaction((CMutableTransaction *)&this_prop);
          _v = &::TX_NO_WITNESS;
          local_108 = (CExtPubKey *)&this_prop;
          UnserializeFromVector<DataStream,ParamsWrapper<TransactionSerParams,CMutableTransaction>>
                    (s,(ParamsWrapper<TransactionSerParams,_CMutableTransaction> *)&v);
          std::optional<CMutableTransaction>::operator=(&this->tx,(CMutableTransaction *)&this_prop)
          ;
          pCVar20 = *(pointer *)
                     &(this->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                      super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
          while (pCVar20 !=
                 *(pointer *)
                  ((long)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                          _M_payload.
                          super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                          super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin
                  + 8)) {
            uVar21 = *(size_type *)((long)&pCVar20->scriptSig + 0x1c);
            uVar4 = uVar21 - 0x1d;
            if (uVar21 < 0x1d) {
              uVar4 = uVar21;
            }
            if ((uVar4 != 0) ||
               (pCVar1 = &pCVar20->scriptWitness, uVar5 = &pCVar20->scriptWitness,
               pCVar20 = pCVar20 + 1, *(pointer *)&pCVar1->stack != *(pointer *)(uVar5 + 8))) {
              pcVar19 = (char *)__cxa_allocate_exception(0x20);
              local_108 = (CExtPubKey *)std::iostream_category();
              _v = (TransactionSerParams *)CONCAT44(uStack_10c,1);
              std::ios_base::failure[abi:cxx11]::failure
                        (pcVar19,(error_code *)
                                 "Unsigned tx does not have empty scriptSigs and scriptWitnesses.");
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                            std::ios_base::failure[abi:cxx11]::~failure);
              }
              goto LAB_0064ea78;
            }
          }
          CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&this_prop);
        }
        else if (uVar10 == 1) {
          if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != 0x4f) {
            pcVar19 = (char *)__cxa_allocate_exception(0x20);
            this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
            this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar19,(error_code *)
                               "Size of key was not the expected size for the type global xpub");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_0064ea78;
          }
          this_prop.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          this_prop.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          this_prop.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT71(this_prop.key.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,0xff);
          CExtPubKey::DecodeWithVersion
                    ((CExtPubKey *)&this_prop,
                     key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start + 1);
          bVar9 = CPubKey::IsFullyValid
                            ((CPubKey *)
                             &this_prop.key.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar9) {
            pcVar19 = (char *)__cxa_allocate_exception(0x20);
            local_108 = (CExtPubKey *)std::iostream_category();
            _v = (TransactionSerParams *)CONCAT44(uStack_10c,1);
            std::ios_base::failure[abi:cxx11]::failure(pcVar19,(error_code *)"Invalid pubkey");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_0064ea78;
          }
          sVar12 = std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>::count
                             (&global_xpubs,(CExtPubKey *)&this_prop);
          if (sVar12 != 0) {
            pcVar19 = (char *)__cxa_allocate_exception(0x20);
            local_108 = (CExtPubKey *)std::iostream_category();
            _v = (TransactionSerParams *)CONCAT44(uStack_10c,1);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar19,(error_code *)"Duplicate key, global xpub already provided");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_0064ea78;
          }
          std::
          _Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
          ::_M_insert_unique<CExtPubKey_const&>
                    ((_Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
                      *)&global_xpubs,(CExtPubKey *)&this_prop);
          keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          DeserializeHDKeypath<DataStream>(s,&keypath);
          sVar13 = std::
                   map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                   ::count(this_00,&keypath);
          if (sVar13 == 0) {
            pCVar22 = (CExtPubKey *)&this_prop;
            pCVar24 = (CExtPubKey *)&v;
            for (lVar17 = 0x71; lVar17 != 0; lVar17 = lVar17 + -1) {
              pCVar24->version[0] = pCVar22->version[0];
              pCVar22 = (CExtPubKey *)((long)pCVar22 + (ulong)bVar27 * -2 + 1);
              pCVar24 = (CExtPubKey *)((long)pCVar24 + (ulong)bVar27 * -2 + 1);
            }
            p_Var14 = (_Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
                       *)std::
                         map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                         ::operator[](this_00,&keypath);
            std::
            _Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
            ::_M_assign_unique<CExtPubKey_const*>
                      (p_Var14,(CExtPubKey *)&v,(CExtPubKey *)&stack0xffffffffffffff64);
          }
          else {
            p_Var14 = (_Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
                       *)std::
                         map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                         ::operator[](this_00,&keypath);
            std::
            _Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
            ::_M_insert_unique<CExtPubKey_const&>(p_Var14,(CExtPubKey *)&this_prop);
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        }
        else if (uVar10 == 0xfb) {
          if ((this->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_engaged == true) {
            pcVar19 = (char *)__cxa_allocate_exception(0x20);
            this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
            this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar19,(error_code *)"Duplicate Key, version already provided");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_0064ea78;
          }
          if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != 1) {
            pcVar19 = (char *)__cxa_allocate_exception(0x20);
            this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
            this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar19,(error_code *)"Global version key is more than one byte type");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_0064ea78;
          }
          UnserializeFromVector<DataStream,unsigned_int&>(s,(uint *)&v);
          (this->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int> =
               (_Optional_payload_base<unsigned_int>)((ulong)_v & 0xffffffff | 0x100000000);
          if (((ulong)_v & 0xffffffff) != 0) {
            pcVar19 = (char *)__cxa_allocate_exception(0x20);
            this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
            this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar19,(error_code *)"Unsupported version number");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_0064ea78;
          }
        }
        else if (uVar10 == 0xfc) {
          this_prop.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          this_prop.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          this_prop.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          this_prop.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          this_prop.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          this_prop.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          Unserialize<SpanReader,unsigned_char,std::allocator<unsigned_char>>
                    (&skey,&this_prop.identifier);
          this_prop.subtype = ReadCompactSize<SpanReader>(&skey,true);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this_prop.key,&key)
          ;
          sVar11 = std::
                   set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
                   ::count(&this->m_proprietary,(key_type *)&this_prop);
          if (sVar11 != 0) {
            pcVar19 = (char *)__cxa_allocate_exception(0x20);
            local_108 = (CExtPubKey *)std::iostream_category();
            _v = (TransactionSerParams *)CONCAT44(uStack_10c,1);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar19,(error_code *)"Duplicate Key, proprietary key already found");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_0064ea78;
          }
          Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,&this_prop.value);
          std::
          _Rb_tree<PSBTProprietary,PSBTProprietary,std::_Identity<PSBTProprietary>,std::less<PSBTProprietary>,std::allocator<PSBTProprietary>>
          ::_M_insert_unique<PSBTProprietary_const&>
                    ((_Rb_tree<PSBTProprietary,PSBTProprietary,std::_Identity<PSBTProprietary>,std::less<PSBTProprietary>,std::allocator<PSBTProprietary>>
                      *)&this->m_proprietary,&this_prop);
          PSBTProprietary::~PSBTProprietary(&this_prop);
        }
        else {
          sVar15 = std::
                   map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ::count(&this->unknown,&key);
          if (sVar15 != 0) {
            pcVar19 = (char *)__cxa_allocate_exception(0x20);
            this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
            this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar19,(error_code *)"Duplicate Key, key for unknown value already provided"
                      );
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_0064ea78;
          }
          this_prop.subtype = 0;
          this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                    (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this_prop);
          std::
          _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
          ::
          _M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                      *)&this->unknown,&key,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this_prop);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&this_prop);
        }
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    } while (puVar6 != puVar7);
    if (bVar8) {
      if ((this->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
          super__Optional_payload<CMutableTransaction,_true,_false,_false>.
          super__Optional_payload_base<CMutableTransaction>._M_engaged == true) {
        uVar18 = 0;
        while( true ) {
          pbVar25 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pbVar23 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          sVar26 = s->m_read_pos;
          lVar17 = *(long *)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                             _M_payload.
                             super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                             super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                             vin;
          pCVar20 = *(pointer *)
                     ((long)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                             _M_payload.
                             super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                             super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                             vin + 8);
          if ((long)pbVar23 - (long)pbVar25 == sVar26) break;
          uVar16 = ((long)pCVar20 - lVar17) / 0x68;
          if (uVar16 <= uVar18) goto LAB_0064df89;
          PSBTInput::PSBTInput((PSBTInput *)&this_prop);
          PSBTInput::Unserialize<DataStream>((PSBTInput *)&this_prop,s);
          std::vector<PSBTInput,_std::allocator<PSBTInput>_>::push_back
                    (&this->inputs,(PSBTInput *)&this_prop);
          if (this_prop.subtype != 0) {
            bVar8 = transaction_identifier<false>::operator!=
                              ((transaction_identifier<false> *)(this_prop.subtype + 0x39),
                               (transaction_identifier<false> *)
                               (*(long *)&(this->tx).
                                          super__Optional_base<CMutableTransaction,_false,_false>.
                                          _M_payload.
                                          super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                          .super__Optional_payload_base<CMutableTransaction>.
                                          _M_payload._M_value.vin + uVar18 * 0x68));
            if (bVar8) {
              pcVar19 = (char *)__cxa_allocate_exception(0x20);
              local_108 = (CExtPubKey *)std::iostream_category();
              _v = (TransactionSerParams *)CONCAT44(uStack_10c,1);
              std::ios_base::failure[abi:cxx11]::failure
                        (pcVar19,(error_code *)"Non-witness UTXO does not match outpoint hash");
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                            std::ios_base::failure[abi:cxx11]::~failure);
              }
              goto LAB_0064ea78;
            }
            lVar17 = *(long *)(this_prop.subtype + 0x20) - *(long *)(this_prop.subtype + 0x18);
            if ((ulong)(lVar17 / 0x28) <=
                (ulong)*(uint *)(*(long *)&(this->tx).
                                           super__Optional_base<CMutableTransaction,_false,_false>.
                                           _M_payload.
                                           super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                           .super__Optional_payload_base<CMutableTransaction>.
                                           _M_payload._M_value.vin + 0x20 + uVar18 * 0x68)) {
              pcVar19 = (char *)__cxa_allocate_exception(0x20,0x28,lVar17 % 0x28);
              local_108 = (CExtPubKey *)std::iostream_category();
              _v = (TransactionSerParams *)CONCAT44(uStack_10c,1);
              std::ios_base::failure[abi:cxx11]::failure
                        (pcVar19,(error_code *)"Input specifies output index that does not exist");
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                            std::ios_base::failure[abi:cxx11]::~failure);
              }
              goto LAB_0064ea78;
            }
          }
          uVar18 = (ulong)((int)uVar18 + 1);
          PSBTInput::~PSBTInput((PSBTInput *)&this_prop);
        }
        uVar16 = ((long)pCVar20 - lVar17) / 0x68;
LAB_0064df89:
        lVar17 = (long)(this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        if (lVar17 / 800 == uVar16) {
          uVar21 = 0;
          while( true ) {
            lVar17 = *(long *)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                               _M_payload.
                               super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                               super__Optional_payload_base<CMutableTransaction>._M_payload._M_value
                               .vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>;
            pCVar3 = *(pointer *)
                      ((long)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                              _M_payload.
                              super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                              super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                              vout + 8);
            if ((long)pbVar23 - (long)pbVar25 == sVar26) break;
            uVar18 = ((long)pCVar3 - lVar17) / 0x28;
            if (uVar18 <= uVar21) goto LAB_0064e10e;
            this_prop.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((ulong)this_prop.value.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage &
                          0xffffffff00000000);
            this_prop.subtype = 0;
            this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            this_prop.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            this_prop.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            this_prop.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            this_prop.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_388._M_color = _S_red;
            local_388._M_parent = (_Base_ptr)0x0;
            local_388._M_left = &local_388;
            local_368 = (_Base_ptr)0x0;
            local_358._M_color = _S_red;
            local_358._M_parent = (_Base_ptr)0x0;
            local_358._M_left = &local_358;
            local_338 = (_Base_ptr)0x0;
            local_328._M_color = _S_red;
            local_328._M_parent = (_Base_ptr)0x0;
            local_328._M_left = &local_328;
            local_308 = (_Base_ptr)0x0;
            local_388._M_right = local_388._M_left;
            local_358._M_right = local_358._M_left;
            local_328._M_right = local_328._M_left;
            PSBTOutput::Unserialize<DataStream>((PSBTOutput *)&this_prop,s);
            std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::push_back
                      (&this->outputs,(PSBTOutput *)&this_prop);
            uVar21 = uVar21 + 1;
            PSBTOutput::~PSBTOutput((PSBTOutput *)&this_prop);
            pbVar25 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pbVar23 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            sVar26 = s->m_read_pos;
          }
          uVar18 = ((long)pCVar3 - lVar17) / 0x28;
LAB_0064e10e:
          lVar17 = (long)(this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (lVar17 / 0x138 == uVar18) {
            std::
            _Rb_tree<CExtPubKey,_CExtPubKey,_std::_Identity<CExtPubKey>,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>
            ::~_Rb_tree(&global_xpubs._M_t);
            std::
            _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~_Rb_tree(&key_lookup._M_t);
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              return;
            }
          }
          else {
            pcVar19 = (char *)__cxa_allocate_exception(0x20,0x138,lVar17 % 0x138);
            this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
            this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar19,(error_code *)
                               "Outputs provided does not match the number of outputs in transaction."
                      );
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
          }
        }
        else {
          pcVar19 = (char *)__cxa_allocate_exception(0x20,pbVar23,lVar17 % 800);
          this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
          this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar19,(error_code *)
                             "Inputs provided does not match the number of inputs in transaction.");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
            __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
        }
      }
      else {
        pcVar19 = (char *)__cxa_allocate_exception(0x20);
        this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar19,(error_code *)"No unsigned transaction was provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
    }
    else {
      pcVar19 = (char *)__cxa_allocate_exception(0x20);
      this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)std::iostream_category();
      this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar19,(error_code *)"Separator is missing at the end of the global map");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
  }
  else {
    pcVar19 = (char *)__cxa_allocate_exception(0x20);
    this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)std::iostream_category();
    this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
    std::ios_base::failure[abi:cxx11]::failure(pcVar19,(error_code *)"Invalid PSBT magic bytes");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      __cxa_throw(pcVar19,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_0064ea78:
  __stack_chk_fail();
}

Assistant:

inline void Unserialize(Stream& s) {
        // Read the magic bytes
        uint8_t magic[5];
        s >> magic;
        if (!std::equal(magic, magic + 5, PSBT_MAGIC_BYTES)) {
            throw std::ios_base::failure("Invalid PSBT magic bytes");
        }

        // Used for duplicate key detection
        std::set<std::vector<unsigned char>> key_lookup;

        // Track the global xpubs we have already seen. Just for sanity checking
        std::set<CExtPubKey> global_xpubs;

        // Read global data
        bool found_sep = false;
        while(!s.empty()) {
            // Read
            std::vector<unsigned char> key;
            s >> key;

            // the key is empty if that was actually a separator byte
            // This is a special case for key lengths 0 as those are not allowed (except for separator)
            if (key.empty()) {
                found_sep = true;
                break;
            }

            // Type is compact size uint at beginning of key
            SpanReader skey{key};
            uint64_t type = ReadCompactSize(skey);

            // Do stuff based on type
            switch(type) {
                case PSBT_GLOBAL_UNSIGNED_TX:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, unsigned tx already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Global unsigned tx key is more than one byte type");
                    }
                    CMutableTransaction mtx;
                    // Set the stream to serialize with non-witness since this should always be non-witness
                    UnserializeFromVector(s, TX_NO_WITNESS(mtx));
                    tx = std::move(mtx);
                    // Make sure that all scriptSigs and scriptWitnesses are empty
                    for (const CTxIn& txin : tx->vin) {
                        if (!txin.scriptSig.empty() || !txin.scriptWitness.IsNull()) {
                            throw std::ios_base::failure("Unsigned tx does not have empty scriptSigs and scriptWitnesses.");
                        }
                    }
                    break;
                }
                case PSBT_GLOBAL_XPUB:
                {
                    if (key.size() != BIP32_EXTKEY_WITH_VERSION_SIZE + 1) {
                        throw std::ios_base::failure("Size of key was not the expected size for the type global xpub");
                    }
                    // Read in the xpub from key
                    CExtPubKey xpub;
                    xpub.DecodeWithVersion(&key.data()[1]);
                    if (!xpub.pubkey.IsFullyValid()) {
                       throw std::ios_base::failure("Invalid pubkey");
                    }
                    if (global_xpubs.count(xpub) > 0) {
                       throw std::ios_base::failure("Duplicate key, global xpub already provided");
                    }
                    global_xpubs.insert(xpub);
                    // Read in the keypath from stream
                    KeyOriginInfo keypath;
                    DeserializeHDKeypath(s, keypath);

                    // Note that we store these swapped to make searches faster.
                    // Serialization uses xpub -> keypath to enqure key uniqueness
                    if (m_xpubs.count(keypath) == 0) {
                        // Make a new set to put the xpub in
                        m_xpubs[keypath] = {xpub};
                    } else {
                        // Insert xpub into existing set
                        m_xpubs[keypath].insert(xpub);
                    }
                    break;
                }
                case PSBT_GLOBAL_VERSION:
                {
                    if (m_version) {
                        throw std::ios_base::failure("Duplicate Key, version already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Global version key is more than one byte type");
                    }
                    uint32_t v;
                    UnserializeFromVector(s, v);
                    m_version = v;
                    if (*m_version > PSBT_HIGHEST_VERSION) {
                        throw std::ios_base::failure("Unsupported version number");
                    }
                    break;
                }
                case PSBT_GLOBAL_PROPRIETARY:
                {
                    PSBTProprietary this_prop;
                    skey >> this_prop.identifier;
                    this_prop.subtype = ReadCompactSize(skey);
                    this_prop.key = key;

                    if (m_proprietary.count(this_prop) > 0) {
                        throw std::ios_base::failure("Duplicate Key, proprietary key already found");
                    }
                    s >> this_prop.value;
                    m_proprietary.insert(this_prop);
                    break;
                }
                // Unknown stuff
                default: {
                    if (unknown.count(key) > 0) {
                        throw std::ios_base::failure("Duplicate Key, key for unknown value already provided");
                    }
                    // Read in the value
                    std::vector<unsigned char> val_bytes;
                    s >> val_bytes;
                    unknown.emplace(std::move(key), std::move(val_bytes));
                }
            }
        }

        if (!found_sep) {
            throw std::ios_base::failure("Separator is missing at the end of the global map");
        }

        // Make sure that we got an unsigned tx
        if (!tx) {
            throw std::ios_base::failure("No unsigned transaction was provided");
        }

        // Read input data
        unsigned int i = 0;
        while (!s.empty() && i < tx->vin.size()) {
            PSBTInput input;
            s >> input;
            inputs.push_back(input);

            // Make sure the non-witness utxo matches the outpoint
            if (input.non_witness_utxo) {
                if (input.non_witness_utxo->GetHash() != tx->vin[i].prevout.hash) {
                    throw std::ios_base::failure("Non-witness UTXO does not match outpoint hash");
                }
                if (tx->vin[i].prevout.n >= input.non_witness_utxo->vout.size()) {
                    throw std::ios_base::failure("Input specifies output index that does not exist");
                }
            }
            ++i;
        }
        // Make sure that the number of inputs matches the number of inputs in the transaction
        if (inputs.size() != tx->vin.size()) {
            throw std::ios_base::failure("Inputs provided does not match the number of inputs in transaction.");
        }

        // Read output data
        i = 0;
        while (!s.empty() && i < tx->vout.size()) {
            PSBTOutput output;
            s >> output;
            outputs.push_back(output);
            ++i;
        }
        // Make sure that the number of outputs matches the number of outputs in the transaction
        if (outputs.size() != tx->vout.size()) {
            throw std::ios_base::failure("Outputs provided does not match the number of outputs in transaction.");
        }
    }